

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeSORegRegOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t uVar2;
  uint32_t RegNo_00;
  DecodeStatus DVar3;
  uint Rs;
  uint type;
  uint Rm;
  ARM_AM_ShiftOpc Shift;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  Rm = 3;
  _Shift = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Val,0,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,5,2);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,8,4);
  DVar3 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Shift);
  _Var1 = Check(&Rm,DVar3);
  if (_Var1) {
    DVar3 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_Shift);
    _Var1 = Check(&Rm,DVar3);
    if (_Var1) {
      type = 2;
      switch(uVar2) {
      case 0:
        type = 2;
        break;
      case 1:
        type = 3;
        break;
      case 2:
        type = 1;
        break;
      case 3:
        type = 4;
      }
      MCOperand_CreateImm0(pMStack_18,(ulong)type);
      Inst_local._4_4_ = Rm;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeSORegRegOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc Shift;

	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned Rs = fieldFromInstruction_4(Val, 8, 4);

	// Register-register
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rs, Address, Decoder)))
		return MCDisassembler_Fail;

	Shift = ARM_AM_lsl;
	switch (type) {
		case 0:
			Shift = ARM_AM_lsl;
			break;
		case 1:
			Shift = ARM_AM_lsr;
			break;
		case 2:
			Shift = ARM_AM_asr;
			break;
		case 3:
			Shift = ARM_AM_ror;
			break;
	}

	MCOperand_CreateImm0(Inst, Shift);

	return S;
}